

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

void __thiscall
cmGeneratorTarget::ComputeLinkClosure(cmGeneratorTarget *this,string *config,LinkClosure *lc)

{
  pointer pbVar1;
  pointer pcVar2;
  pointer pcVar3;
  char *pcVar4;
  cmGlobalGenerator *pcVar5;
  LinkClosure *pLVar6;
  bool bVar7;
  cmLinkImplementation *pcVar8;
  char *pcVar9;
  long *plVar10;
  size_type *psVar11;
  cmLinkImplItem *lib;
  pointer item;
  string *li;
  pointer pbVar12;
  long *plVar13;
  string *l;
  vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *__range1;
  string propagates;
  cmTargetSelectLinker tsl;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  languages;
  cmTargetCollectLinkLanguages cll;
  string local_180;
  LinkClosure *local_160;
  undefined1 local_158 [24];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  long *local_c0;
  undefined8 uStack_b8;
  undefined4 local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  cmTargetCollectLinkLanguages local_98;
  
  local_d0._M_allocated_capacity = (size_type)&uStack_a0;
  local_d0._8_8_ = 1;
  local_c0 = (long *)0x0;
  uStack_b8 = 0;
  local_b0 = 0x3f800000;
  local_a8 = 0;
  uStack_a0 = 0;
  pcVar8 = GetLinkImplementation(this,config);
  local_160 = lc;
  if (pcVar8 != (cmLinkImplementation *)0x0) {
    pbVar12 = (pcVar8->Languages).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (pcVar8->Languages).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar12 != pbVar1) {
      do {
        local_98.Config._M_dataplus._M_p = (pointer)&local_d0;
        std::
        _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                  ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)&local_d0,pbVar12,&local_98);
        pbVar12 = pbVar12 + 1;
      } while (pbVar12 != pbVar1);
    }
    pcVar2 = (config->_M_dataplus)._M_p;
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,pcVar2,pcVar2 + config->_M_string_length);
    cmTargetCollectLinkLanguages::cmTargetCollectLinkLanguages
              (&local_98,this,&local_f0,
               (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_d0,this);
    pLVar6 = local_160;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    item = (pcVar8->super_cmLinkImplementationLibraries).Libraries.
           super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
           super__Vector_impl_data._M_start;
    pcVar3 = (pcVar8->super_cmLinkImplementationLibraries).Libraries.
             super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (item != pcVar3) {
      do {
        cmTargetCollectLinkLanguages::Visit(&local_98,&item->super_cmLinkItem);
        item = item + 1;
      } while (item != pcVar3);
    }
    if (local_c0 != (long *)0x0) {
      plVar13 = local_c0;
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&pLVar6->Languages,(value_type *)(plVar13 + 1));
        plVar13 = (long *)*plVar13;
      } while (plVar13 != (long *)0x0);
    }
    pcVar2 = local_158 + 0x10;
    local_158._16_4_ = 0x5f534148;
    local_158._8_8_ = (cmGeneratorTarget *)0x7;
    local_158._20_4_ = 0x585843;
    local_158._0_8_ = pcVar2;
    pcVar9 = GetProperty(this,(string *)local_158);
    if ((pointer)local_158._0_8_ != pcVar2) {
      operator_delete((void *)local_158._0_8_,CONCAT44(local_158._20_4_,local_158._16_4_) + 1);
    }
    if (pcVar9 == (char *)0x0) {
      local_158._16_4_ = 0x4b4e494c;
      local_158._20_4_ = 0x4c5f5245;
      local_140._M_impl._0_7_ = 0x45474155474e41;
      local_158._8_8_ = (cmGeneratorTarget *)0xf;
      local_140._M_impl._7_1_ = '\0';
      local_158._0_8_ = pcVar2;
      pcVar9 = GetProperty(this,(string *)local_158);
      if ((pointer)local_158._0_8_ != pcVar2) {
        operator_delete((void *)local_158._0_8_,CONCAT44(local_158._20_4_,local_158._16_4_) + 1);
      }
      if (pcVar9 == (char *)0x0) {
        local_140._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_140._M_impl.super__Rb_tree_header._M_header;
        local_158._0_8_ = local_158._0_8_ & 0xffffffff00000000;
        local_140._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_140._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_140._M_impl.super__Rb_tree_header._M_node_count = 0;
        pcVar5 = this->LocalGenerator->GlobalGenerator;
        local_158._16_4_ = SUB84(pcVar5,0);
        local_158._20_4_ = (undefined4)((ulong)pcVar5 >> 0x20);
        pbVar12 = (pcVar8->Languages).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar1 = (pcVar8->Languages).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_158._8_8_ = this;
        local_140._M_impl.super__Rb_tree_header._M_header._M_right =
             local_140._M_impl.super__Rb_tree_header._M_header._M_left;
        if (pbVar12 != pbVar1) {
          do {
            cmTargetSelectLinker::Consider
                      ((cmTargetSelectLinker *)local_158,(pbVar12->_M_dataplus)._M_p);
            pbVar12 = pbVar12 + 1;
          } while (pbVar12 != pbVar1);
        }
        if (local_c0 != (long *)0x0) {
          plVar13 = local_c0;
          do {
            std::operator+(&local_110,"CMAKE_",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (plVar13 + 1));
            plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
            psVar11 = (size_type *)(plVar10 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar11) {
              local_180.field_2._M_allocated_capacity = *psVar11;
              local_180.field_2._8_8_ = plVar10[3];
              local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
            }
            else {
              local_180.field_2._M_allocated_capacity = *psVar11;
              local_180._M_dataplus._M_p = (pointer)*plVar10;
            }
            local_180._M_string_length = plVar10[1];
            *plVar10 = (long)psVar11;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p != &local_110.field_2) {
              operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1
                             );
            }
            bVar7 = cmMakefile::IsOn(this->Makefile,&local_180);
            if (bVar7) {
              cmTargetSelectLinker::Consider
                        ((cmTargetSelectLinker *)local_158,
                         (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (plVar13 + 1))->_M_dataplus)._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_180._M_dataplus._M_p != &local_180.field_2) {
              operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1
                             );
            }
            plVar13 = (long *)*plVar13;
          } while (plVar13 != (long *)0x0);
        }
        cmTargetSelectLinker::Choose_abi_cxx11_(&local_180,(cmTargetSelectLinker *)local_158);
        std::__cxx11::string::operator=((string *)local_160,(string *)&local_180);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_dataplus._M_p != &local_180.field_2) {
          operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree(&local_140);
      }
      else {
        pcVar4 = (char *)(pLVar6->LinkerLanguage)._M_string_length;
        strlen(pcVar9);
        std::__cxx11::string::_M_replace((ulong)pLVar6,0,pcVar4,(ulong)pcVar9);
      }
    }
    else {
      std::__cxx11::string::_M_replace
                ((ulong)pLVar6,0,(char *)(pLVar6->LinkerLanguage)._M_string_length,0x4cb32b);
    }
    std::
    _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
    ::~_Rb_tree(&local_98.Visited._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.Config._M_dataplus._M_p != &local_98.Config.field_2) {
      operator_delete(local_98.Config._M_dataplus._M_p,
                      local_98.Config.field_2._M_allocated_capacity + 1);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)&local_d0);
    return;
  }
  __assert_fail("impl",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmGeneratorTarget.cxx"
                ,0x7f3,
                "void cmGeneratorTarget::ComputeLinkClosure(const std::string &, LinkClosure &) const"
               );
}

Assistant:

void cmGeneratorTarget::ComputeLinkClosure(const std::string& config,
                                           LinkClosure& lc) const
{
  // Get languages built in this target.
  std::unordered_set<std::string> languages;
  cmLinkImplementation const* impl = this->GetLinkImplementation(config);
  assert(impl);
  for (std::string const& li : impl->Languages) {
    languages.insert(li);
  }

  // Add interface languages from linked targets.
  cmTargetCollectLinkLanguages cll(this, config, languages, this);
  for (cmLinkImplItem const& lib : impl->Libraries) {
    cll.Visit(lib);
  }

  // Store the transitive closure of languages.
  for (std::string const& lang : languages) {
    lc.Languages.push_back(lang);
  }

  // Choose the language whose linker should be used.
  if (this->GetProperty("HAS_CXX")) {
    lc.LinkerLanguage = "CXX";
  } else if (const char* linkerLang = this->GetProperty("LINKER_LANGUAGE")) {
    lc.LinkerLanguage = linkerLang;
  } else {
    // Find the language with the highest preference value.
    cmTargetSelectLinker tsl(this);

    // First select from the languages compiled directly in this target.
    for (std::string const& l : impl->Languages) {
      tsl.Consider(l.c_str());
    }

    // Now consider languages that propagate from linked targets.
    for (std::string const& lang : languages) {
      std::string propagates =
        "CMAKE_" + lang + "_LINKER_PREFERENCE_PROPAGATES";
      if (this->Makefile->IsOn(propagates)) {
        tsl.Consider(lang.c_str());
      }
    }

    lc.LinkerLanguage = tsl.Choose();
  }
}